

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

int os_get_abs_filename(char *buf,size_t buflen,char *filename)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong __n;
  char pwd [4096];
  char acStack_1018 [4096];
  
  iVar1 = os_is_file_absolute(filename);
  if (iVar1 == 0) {
    pcVar2 = getcwd(acStack_1018,0x1000);
    if (pcVar2 != (char *)0x0) {
      os_build_full_path(buf,buflen,acStack_1018,filename);
      goto LAB_0010f0ae;
    }
  }
  safe_strcpy(buf,buflen,filename);
LAB_0010f0ae:
  canonicalize_path(buf);
  pcVar2 = realpath(filename,(char *)0x0);
  if (pcVar2 != (char *)0x0) {
    if (pcVar2 != buf && (buflen != 0 && buf != (char *)0x0)) {
      sVar3 = strlen(pcVar2);
      __n = buflen - 1;
      if (sVar3 < buflen - 1) {
        __n = sVar3;
      }
      memcpy(buf,pcVar2,__n);
      buf[__n] = '\0';
    }
    free(pcVar2);
  }
  return 1;
}

Assistant:

int
os_get_abs_filename( char* buf, size_t buflen, const char* filename )
{
    // If the filename is already absolute, copy it; otherwise combine
    // it with the working directory.
    if (os_is_file_absolute(filename))
    {
        // absolute - copy it as-is
        safe_strcpy(buf, buflen, filename);
    }
    else
    {
        // combine it with the working directory to get the path
        char pwd[OSFNMAX];
        if (getcwd(pwd, sizeof(pwd)) != 0)
            os_build_full_path(buf, buflen, pwd, filename);
        else
            safe_strcpy(buf, buflen, filename);
    }

    // canonicalize the result
    canonicalize_path(buf);

    // Try getting the canonical path from the OS (allocating the
    // result buffer).
    const std::unique_ptr<char, decltype(&free)>
            newpath(realpath(filename, nullptr), &free);
    if (newpath) {
        // Copy the output (truncating if it's too long).
        safe_strcpy(buf, buflen, newpath.get());
    }

    // realpath() might have failed, but that's okay - realpath() only works
    // if the path refers to an existing file, but it's valid for callers to
    // pass non-existent filenames, such as names of files they're about to
    // create, or hypothetical paths being used for comparison purposes or
    // for future use.  Simply return the canonical path name we generated
    // above.
    return true;
}